

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isCubeLevelCompareResultValid
               (TextureCubeView *texture,int levelNdx,Sampler *sampler,FilterMode filterMode,
               TexComparePrecision *prec,CubeFaceFloatCoords *coords,float cmpReference,float result
               )

{
  int *piVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  undefined1 auVar4 [16];
  TextureFormat TVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ConstPixelBufferAccess *pCVar8;
  CubeFaceFloatCoords *pCVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  ConstPixelBufferAccess **ppCVar13;
  long lVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  CubeFaceIntCoords CVar20;
  CubeFaceIntCoords CVar21;
  CubeFaceIntCoords CVar22;
  CubeFaceIntCoords CVar23;
  Vec4 depths;
  int j;
  Vec2 uBounds;
  Vec2 vBounds;
  ConstPixelBufferAccess faces [6];
  Vector<float,_4> local_1fc;
  float local_1ec;
  ConstPixelBufferAccess *local_1e8;
  ConstPixelBufferAccess *local_1e0;
  float local_1d4;
  ulong local_1d0;
  int local_1c4;
  uint local_1c0;
  uint local_1bc;
  float local_1b8;
  float local_1b4;
  int local_1b0;
  int local_1ac;
  ulong local_1a8;
  float local_1a0;
  float fStack_19c;
  Sampler *local_198;
  TexComparePrecision *local_190;
  CubeFaceFloatCoords *local_188;
  ConstPixelBufferAccess *local_180;
  ConstPixelBufferAccess *local_178;
  Vec2 local_170;
  Vec2 local_168;
  float local_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  uint uStack_140;
  uint uStack_13c;
  float local_138;
  float fStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [20];
  undefined8 uStack_114;
  undefined8 auStack_108 [27];
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      ppCVar13 = texture->m_levels;
      local_1b8 = cmpReference;
      local_1b4 = result;
      bVar10 = isFixedPointDepthTextureFormat(&texture->m_levels[0][levelNdx].m_format);
      local_1e8 = (ConstPixelBufferAccess *)CONCAT71(local_1e8._1_7_,bVar10);
      iVar2 = texture->m_levels[coords->face][levelNdx].m_size.m_data[0];
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_1a0,sampler->normalizedCoords,iVar2,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_1b0 = iVar2;
      local_190 = prec;
      local_188 = coords;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_160,sampler->normalizedCoords,iVar2,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar17 = local_1a0 + -0.5;
      fVar18 = fStack_19c + -0.5;
      local_1ec = local_160 + -0.5;
      local_1e0 = (ConstPixelBufferAccess *)CONCAT44(local_1e0._4_4_,fStack_15c + -0.5);
      lVar14 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)(local_128 + lVar14));
        lVar14 = lVar14 + 0x28;
      } while (lVar14 != 0xf0);
      fVar17 = floorf(fVar17);
      local_1d0 = CONCAT44(local_1d0._4_4_,fVar17);
      fVar17 = floorf(local_1ec);
      local_1c0 = (uint)(float)local_1d0;
      for (lVar14 = 0; lVar14 != 0x1e; lVar14 = lVar14 + 5) {
        pCVar3 = *ppCVar13;
        *(void **)(local_128 + lVar14 * 8 + 0x20) = pCVar3[levelNdx].m_data;
        TVar5 = pCVar3[levelNdx].m_format;
        uVar6 = *(undefined8 *)pCVar3[levelNdx].m_size.m_data;
        piVar1 = pCVar3[levelNdx].m_size.m_data + 2;
        uVar7 = *(undefined8 *)(piVar1 + 2);
        *(undefined8 *)(local_128 + (lVar14 * 2 + -1) * 4 + 0x14) = *(undefined8 *)piVar1;
        *(undefined8 *)(local_128 + (lVar14 * 2 + 1) * 4 + 0x14) = uVar7;
        *(TextureFormat *)(local_128 + (lVar14 * 2 + -2) * 4 + 8) = TVar5;
        *(undefined8 *)(local_128 + lVar14 * 8 + 8) = uVar6;
        ppCVar13 = ppCVar13 + 1;
      }
      local_198 = sampler;
      fVar18 = floorf(fVar18);
      fVar15 = floorf(local_1e0._0_4_);
      local_1d4 = (float)(int)fVar17;
      local_1ac = (int)fVar18;
      local_1c4 = (int)fVar15;
      local_1bc = (uint)(byte)local_1e8;
      while( true ) {
        local_1a8 = (ulong)(uint)local_1d4;
        bVar10 = (int)local_1d4 <= local_1c4;
        if (local_1c4 < (int)local_1d4) break;
        local_158 = (float)(int)local_1d4;
        local_1d4 = (float)((int)local_1d4 + 1);
        uVar12 = (ulong)local_1c0;
        fStack_154 = local_158;
        fStack_150 = local_158;
        fStack_14c = local_158;
        while (pCVar9 = local_188, iVar2 = local_1b0, fVar17 = (float)uVar12,
              (int)fVar17 <= local_1ac) {
          local_1fc.m_data[0] = (float)local_188->face;
          fVar18 = (float)local_1a8;
          local_1fc.m_data[1] = fVar17;
          local_1fc.m_data[2] = fVar18;
          CVar20 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1fc,local_1b0);
          local_1e0 = CVar20._0_8_;
          local_1fc.m_data[0] = (float)pCVar9->face;
          fVar15 = (float)((int)fVar17 + 1);
          local_1fc.m_data[1] = fVar15;
          local_1fc.m_data[2] = fVar18;
          CVar21 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1fc,iVar2);
          fVar18 = local_1d4;
          local_1e8 = CVar21._0_8_;
          local_1fc.m_data[0] = (float)pCVar9->face;
          local_1fc.m_data[2] = local_1d4;
          local_1fc.m_data[1] = fVar17;
          CVar22 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1fc,iVar2);
          pCVar8 = local_1e0;
          local_1ec = (float)CVar22.t;
          local_1fc.m_data[0] = (float)pCVar9->face;
          local_1fc.m_data[2] = fVar18;
          local_1fc.m_data[1] = fVar15;
          CVar23 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1fc,iVar2);
          pCVar3 = local_1e8;
          uVar12 = (ulong)pCVar8 & 0xffffffff;
          if (uVar12 == 6) {
            return bVar10;
          }
          if (CVar22.face == CUBEFACE_LAST) {
            return bVar10;
          }
          if ((int)local_1e8 == 6) {
            return bVar10;
          }
          if (CVar23.face == CUBEFACE_LAST) {
            return bVar10;
          }
          fVar17 = (float)(int)fVar17;
          local_180 = (ConstPixelBufferAccess *)(local_128 + uVar12 * 0x28);
          local_178 = (ConstPixelBufferAccess *)(local_128 + ((ulong)local_1e8 & 0xffffffff) * 0x28)
          ;
          local_1e0 = (ConstPixelBufferAccess *)(local_128 + (CVar22._0_8_ & 0xffffffff) * 0x28);
          local_1e8 = (ConstPixelBufferAccess *)(local_128 + (CVar23._0_8_ & 0xffffffff) * 0x28);
          fVar18 = (local_1a0 + -0.5) - fVar17;
          fVar19 = (fStack_19c + -0.5) - fVar17;
          auVar16._4_4_ = fVar19;
          auVar16._0_4_ = fVar18;
          auVar16._8_4_ = 0.0 - fVar17;
          auVar16._12_4_ = 0.0 - fVar17;
          auVar16 = minps(_DAT_01675880,auVar16);
          local_138 = (float)(-(uint)(0.0 <= fVar18) & auVar16._0_4_);
          fStack_134 = (float)(-(uint)(0.0 <= fVar19) & auVar16._4_4_);
          uStack_130 = -(uint)(0.0 <= 0.0 - fVar17) & auVar16._8_4_;
          uStack_12c = -(uint)(0.0 <= 0.0 - fVar17) & auVar16._12_4_;
          fVar17 = (local_160 + -0.5) - local_158;
          fVar18 = (fStack_15c + -0.5) - fStack_154;
          auVar4._4_4_ = fVar18;
          auVar4._0_4_ = fVar17;
          auVar4._8_4_ = 0.0 - fStack_150;
          auVar4._12_4_ = 0.0 - fStack_14c;
          auVar16 = minps(_DAT_01675880,auVar4);
          local_148 = (float)(-(uint)(0.0 <= fVar17) & auVar16._0_4_);
          fStack_144 = (float)(-(uint)(0.0 <= fVar18) & auVar16._4_4_);
          uStack_140 = -(uint)(0.0 <= 0.0 - fStack_150) & auVar16._8_4_;
          uStack_13c = -(uint)(0.0 <= 0.0 - fStack_14c) & auVar16._12_4_;
          local_1d0 = (ulong)(uint)fVar15;
          Vector<float,_4>::Vector(&local_1fc);
          local_1fc.m_data[0] =
               ConstPixelBufferAccess::getPixDepth
                         (local_180,(int)((ulong)pCVar8 >> 0x20),CVar20.t,0);
          local_1fc.m_data[1] =
               ConstPixelBufferAccess::getPixDepth
                         (local_178,(int)((ulong)pCVar3 >> 0x20),CVar21.t,0);
          local_1fc.m_data[2] =
               ConstPixelBufferAccess::getPixDepth(local_1e0,CVar22.s,(int)local_1ec,0);
          local_1fc.m_data[3] = ConstPixelBufferAccess::getPixDepth(local_1e8,CVar23.s,CVar23.t,0);
          local_168.m_data[1] = fStack_134;
          local_168.m_data[0] = local_138;
          local_170.m_data[1] = fStack_144;
          local_170.m_data[0] = local_148;
          bVar11 = isBilinearCompareValid
                             (local_198->compare,local_190,&local_1fc,&local_168,&local_170,
                              local_1b8,local_1b4,SUB41(local_1bc,0));
          uVar12 = local_1d0;
          if (bVar11) {
            return bVar10;
          }
        }
      }
    }
    else {
      local_128._0_4_ = coords->s;
      local_128._4_4_ = coords->t;
      bVar10 = isLinearCompareResultValid
                         (texture->m_levels[coords->face] + levelNdx,sampler,prec,(Vec2 *)local_128,
                          0,cmpReference,result);
    }
  }
  else {
    local_128._0_4_ = coords->s;
    local_128._4_4_ = coords->t;
    bVar10 = isNearestCompareResultValid
                       (texture->m_levels[coords->face] + levelNdx,sampler,prec,(Vec2 *)local_128,0,
                        cmpReference,result);
  }
  return bVar10;
}

Assistant:

static bool isCubeLevelCompareResultValid (const TextureCubeView&			texture,
										   const int						levelNdx,
										   const Sampler&					sampler,
										   const Sampler::FilterMode		filterMode,
										   const TexComparePrecision&		prec,
										   const CubeFaceFloatCoords&		coords,
										   const float						cmpReference,
										   const float						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearCompareResultValid(texture, levelNdx, sampler, prec, coords, cmpReference, result);
		else
			return isLinearCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
	}
	else
		return isNearestCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
}